

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O2

void PDHG_Update_Average(CUPDLPwork *work)

{
  CUPDLPiterates *pCVar1;
  CUPDLPdata *pCVar2;
  CUPDLPstepsize *pCVar3;
  CUPDLPvec *pCVar4;
  CUPDLPvec *pCVar5;
  int iVar6;
  double __x;
  cupdlp_float dMeanStepSize;
  
  pCVar1 = work->iterates;
  pCVar2 = work->problem->data;
  pCVar3 = work->stepsize;
  iVar6 = (work->timers->nIter + 1) % 2;
  pCVar4 = pCVar1->x[iVar6];
  __x = pCVar3->dPrimalStep * pCVar3->dDualStep;
  pCVar5 = pCVar1->y[iVar6];
  if (__x < 0.0) {
    dMeanStepSize = sqrt(__x);
  }
  else {
    dMeanStepSize = SQRT(__x);
  }
  cupdlp_axpy(work,pCVar2->nCols,&dMeanStepSize,pCVar4->data,pCVar1->xSum);
  cupdlp_axpy(work,pCVar2->nRows,&dMeanStepSize,pCVar5->data,pCVar1->ySum);
  pCVar3->dSumPrimalStep = dMeanStepSize + pCVar3->dSumPrimalStep;
  pCVar3->dSumDualStep = dMeanStepSize + pCVar3->dSumDualStep;
  return;
}

Assistant:

void PDHG_Update_Average(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];

  // PDLP weighs average iterates in this way
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);
  // AddToVector(iterates->xSum, dMeanStepSize, xUpdate, lp->nCols);
  // AddToVector(iterates->ySum, dMeanStepSize, yUpdate, lp->nRows);
  cupdlp_axpy(work, lp->nCols, &dMeanStepSize, xUpdate->data, iterates->xSum);
  cupdlp_axpy(work, lp->nRows, &dMeanStepSize, yUpdate->data, iterates->ySum);

  stepsize->dSumPrimalStep += dMeanStepSize;
  stepsize->dSumDualStep += dMeanStepSize;
}